

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::ImageButton(Texture *texture,Vector2f *size,int framePadding,Color *bgColor,
                       Color *tintColor)

{
  Color CVar1;
  bool bVar2;
  uint uVar3;
  ImVec2 local_60;
  ImVec2 local_58;
  Vector2f local_50;
  ImVec4 local_48;
  ImVec4 local_38;
  
  uVar3 = sf::Texture::getNativeHandle(texture);
  local_50 = *size;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_60.x = 1.0;
  local_60.y = 1.0;
  CVar1 = *bgColor;
  local_38.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
  local_38.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
  local_38.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
  local_38.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
  CVar1 = *tintColor;
  local_48.x = (float)((uint)CVar1 & 0xff) * 0.003921569;
  local_48.y = (float)((uint)CVar1 >> 8 & 0xff) * 0.003921569;
  local_48.z = (float)((uint)CVar1 >> 0x10 & 0xff) * 0.003921569;
  local_48.w = (float)((uint)CVar1 >> 0x18) * 0.003921569;
  bVar2 = ImageButton((ImTextureID)(ulong)uVar3,(ImVec2 *)&local_50,&local_58,&local_60,framePadding
                      ,&local_38,&local_48);
  return bVar2;
}

Assistant:

bool ImageButton(const sf::Texture& texture, const sf::Vector2f& size, const int framePadding,
                 const sf::Color& bgColor, const sf::Color& tintColor) {
    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());

    return ImGui::ImageButton(textureID, ImVec2(size.x, size.y), ImVec2(0, 0), ImVec2(1, 1),
                              framePadding, toImColor(bgColor), toImColor(tintColor));
}